

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O2

void __thiscall TCPStream::~TCPStream(TCPStream *this)

{
  close(this->m_sd);
  std::__cxx11::string::~string((string *)&this->m_peerIP);
  return;
}

Assistant:

TCPStream::~TCPStream()
{
    close(m_sd);
}